

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_mapping_api.cpp
# Opt level: O0

string * cfd::api::json::
         ExecuteDirectApi<cfd::api::json::DecodeRawTransactionRequest,cfd::api::json::DecodeRawTransactionResponse>
                   (string *request_message,
                   function<void_(cfd::api::json::DecodeRawTransactionRequest_*,_cfd::api::json::DecodeRawTransactionResponse_*)>
                   *function)

{
  string *in_RDI;
  DecodeRawTransactionResponse response;
  CfdException *cfd_except;
  CfdException ex;
  DecodeRawTransactionRequest req;
  DecodeRawTransactionResponse *in_stack_fffffffffffffdf0;
  DecodeRawTransactionRequest *in_stack_fffffffffffffdf8;
  function<void_(cfd::api::json::DecodeRawTransactionRequest_*,_cfd::api::json::DecodeRawTransactionResponse_*)>
  *in_stack_fffffffffffffe00;
  DecodeRawTransactionRequest *in_stack_fffffffffffffe30;
  DecodeRawTransactionResponse *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe58;
  JsonClassBase<cfd::api::json::DecodeRawTransactionRequest> *in_stack_fffffffffffffe60;
  JsonClassBase<cfd::api::json::DecodeRawTransactionResponse> *in_stack_ffffffffffffff48;
  
  DecodeRawTransactionRequest::DecodeRawTransactionRequest(in_stack_fffffffffffffe30);
  core::JsonClassBase<cfd::api::json::DecodeRawTransactionRequest>::Deserialize
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  DecodeRawTransactionResponse::DecodeRawTransactionResponse(in_stack_fffffffffffffe40);
  std::
  function<void_(cfd::api::json::DecodeRawTransactionRequest_*,_cfd::api::json::DecodeRawTransactionResponse_*)>
  ::operator()(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  core::JsonClassBase<cfd::api::json::DecodeRawTransactionResponse>::Serialize_abi_cxx11_
            (in_stack_ffffffffffffff48);
  DecodeRawTransactionResponse::~DecodeRawTransactionResponse(in_stack_fffffffffffffdf0);
  DecodeRawTransactionRequest::~DecodeRawTransactionRequest
            ((DecodeRawTransactionRequest *)in_stack_fffffffffffffdf0);
  return in_RDI;
}

Assistant:

std::string ExecuteDirectApi(
    const std::string &request_message,
    std::function<void(RequestType *, ResponseType *)>
        function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    throw cfd_except;
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    throw ex;
  }

  ResponseType response;
  function(&req, &response);
  return response.Serialize();
}